

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O0

DdNode * Cudd_addTimesPlus(DdManager *dd,DdNode *A,DdNode *B,DdNode **z,int nz)

{
  DdNode *n;
  DdNode *n_00;
  int local_5c;
  int i;
  DdNode *res;
  DdNode *tmp;
  DdNode *cube;
  DdNode *w;
  int nz_local;
  DdNode **z_local;
  DdNode *B_local;
  DdNode *A_local;
  DdManager *dd_local;
  
  n = Cudd_addApply(dd,Cudd_addTimes,A,B);
  if (n == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    Cudd_Ref(n);
    tmp = dd->one;
    Cudd_Ref(tmp);
    for (local_5c = nz + -1; -1 < local_5c; local_5c = local_5c + -1) {
      n_00 = Cudd_addIte(dd,z[local_5c],tmp,dd->zero);
      if (n_00 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        return (DdNode *)0x0;
      }
      Cudd_Ref(n_00);
      Cudd_RecursiveDeref(dd,tmp);
      tmp = n_00;
    }
    dd_local = (DdManager *)Cudd_addExistAbstract(dd,n,tmp);
    if (dd_local == (DdManager *)0x0) {
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,tmp);
      dd_local = (DdManager *)0x0;
    }
    else {
      Cudd_Ref((DdNode *)dd_local);
      Cudd_RecursiveDeref(dd,tmp);
      Cudd_RecursiveDeref(dd,n);
      Cudd_Deref((DdNode *)dd_local);
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addTimesPlus(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  DdNode ** z,
  int  nz)
{
    DdNode *w, *cube, *tmp, *res; 
    int i;
    tmp = Cudd_addApply(dd,Cudd_addTimes,A,B);
    if (tmp == NULL) return(NULL);
    Cudd_Ref(tmp);
    Cudd_Ref(cube = DD_ONE(dd));
    for (i = nz-1; i >= 0; i--) {
         w = Cudd_addIte(dd,z[i],cube,DD_ZERO(dd));
         if (w == NULL) {
            Cudd_RecursiveDeref(dd,tmp);
            return(NULL);
         }
         Cudd_Ref(w);
         Cudd_RecursiveDeref(dd,cube);
         cube = w;
    }
    res = Cudd_addExistAbstract(dd,tmp,cube);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,tmp);
        Cudd_RecursiveDeref(dd,cube);
        return(NULL);
    }
    Cudd_Ref(res);
    Cudd_RecursiveDeref(dd,cube);
    Cudd_RecursiveDeref(dd,tmp);
    Cudd_Deref(res);
    return(res);

}